

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::SGDOptimizer::ByteSizeLong(SGDOptimizer *this)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  
  if (this->learningrate_ == (DoubleParameter *)0x0 ||
      this == (SGDOptimizer *)&_SGDOptimizer_default_instance_) {
    sVar2 = 0;
  }
  else {
    sVar2 = DoubleParameter::ByteSizeLong(this->learningrate_);
    uVar4 = (uint)sVar2 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar2 = sVar2 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->minibatchsize_ != (Int64Parameter *)0x0 &&
      this != (SGDOptimizer *)&_SGDOptimizer_default_instance_) {
    sVar3 = Int64Parameter::ByteSizeLong(this->minibatchsize_);
    uVar4 = (uint)sVar3 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar2 = sVar2 + sVar3 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->momentum_ != (DoubleParameter *)0x0 &&
      this != (SGDOptimizer *)&_SGDOptimizer_default_instance_) {
    sVar3 = DoubleParameter::ByteSizeLong(this->momentum_);
    uVar4 = (uint)sVar3 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar2 = sVar2 + sVar3 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t SGDOptimizer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SGDOptimizer)
  size_t total_size = 0;

  // .CoreML.Specification.DoubleParameter learningRate = 1;
  if (this->has_learningrate()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->learningrate_);
  }

  // .CoreML.Specification.Int64Parameter miniBatchSize = 2;
  if (this->has_minibatchsize()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->minibatchsize_);
  }

  // .CoreML.Specification.DoubleParameter momentum = 3;
  if (this->has_momentum()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->momentum_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}